

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gssc.c
# Opt level: O1

Ssh_gss_stat ssh_gssapi_import_name(ssh_gss_library *lib,char *host,Ssh_gss_name *srv_name)

{
  OM_uint32 OVar1;
  Ssh_gss_stat SVar2;
  char *__s;
  OM_uint32 min_stat;
  gss_buffer_desc host_buf;
  OM_uint32 local_34;
  gss_buffer_desc_struct local_30;
  
  __s = dupcat_fn("host@",host,0);
  local_30.value = __s;
  local_30.length = strlen(__s);
  OVar1 = (*(lib->u).gssapi.import_name)(&local_34,&local_30,GSS_C_NT_HOSTBASED_SERVICE,srv_name);
  safefree(__s);
  SVar2 = SSH_GSS_FAILURE;
  if (OVar1 == 0) {
    SVar2 = SSH_GSS_OK;
  }
  return SVar2;
}

Assistant:

static Ssh_gss_stat ssh_gssapi_import_name(struct ssh_gss_library *lib,
                                           char *host,
                                           Ssh_gss_name *srv_name)
{
    struct gssapi_functions *gss = &lib->u.gssapi;
    OM_uint32 min_stat,maj_stat;
    gss_buffer_desc host_buf;
    char *pStr;

    pStr = dupcat("host@", host);

    host_buf.value = pStr;
    host_buf.length = strlen(pStr);

    maj_stat = gss->import_name(&min_stat, &host_buf,
                                GSS_C_NT_HOSTBASED_SERVICE, srv_name);
    /* Release buffer */
    sfree(pStr);
    if (maj_stat == GSS_S_COMPLETE) return SSH_GSS_OK;
    return SSH_GSS_FAILURE;
}